

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnvmbcs.cpp
# Opt level: O1

UConverterType ucnv_MBCSGetType_63(UConverter *converter)

{
  UConverterSharedData *pUVar1;
  UConverterType UVar2;
  
  pUVar1 = converter->sharedData;
  UVar2 = UCNV_SBCS;
  if ((((pUVar1->mbcs).countStates != '\x01') &&
      (UVar2 = UCNV_EBCDIC_STATEFUL, (pUVar1->mbcs).outputType != '\f')) &&
     ((pUVar1->staticData->minBytesPerChar != '\x02' ||
      (UVar2 = UCNV_DBCS, pUVar1->staticData->maxBytesPerChar != '\x02')))) {
    UVar2 = UCNV_MBCS;
  }
  return UVar2;
}

Assistant:

U_CFUNC UConverterType
ucnv_MBCSGetType(const UConverter* converter) {
    /* SBCS, DBCS, and EBCDIC_STATEFUL are replaced by MBCS, but here we cheat a little */
    if(converter->sharedData->mbcs.countStates==1) {
        return (UConverterType)UCNV_SBCS;
    } else if((converter->sharedData->mbcs.outputType&0xff)==MBCS_OUTPUT_2_SISO) {
        return (UConverterType)UCNV_EBCDIC_STATEFUL;
    } else if(converter->sharedData->staticData->minBytesPerChar==2 && converter->sharedData->staticData->maxBytesPerChar==2) {
        return (UConverterType)UCNV_DBCS;
    }
    return (UConverterType)UCNV_MBCS;
}